

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::rollModerateComputer(Dice *this)

{
  key_type kVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_78;
  int local_48;
  DiceOptions local_44;
  int i_2;
  DiceOptions value_2;
  key_type local_38 [3];
  DiceOptions local_2c;
  int i_1;
  DiceOptions value_1;
  key_type local_20 [3];
  DiceOptions local_14;
  int i;
  DiceOptions value;
  Dice *this_local;
  
  _i = this;
  for (local_20[2] = 0; (int)local_20[2] < 6; local_20[2] = local_20[2] + 1) {
    local_14 = randomDiceOption(this);
    pmVar4 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,&local_14);
    *pmVar4 = *pmVar4 + 1;
  }
  local_20[1] = 3;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_20 + 1);
  iVar2 = *pmVar4;
  local_20[0] = Heal;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_20);
  *pmVar4 = iVar2 + *pmVar4;
  value_1 = Energy;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,&value_1);
  iVar2 = *pmVar4;
  i_1 = 0;
  pmVar4 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,(key_type *)&i_1);
  *pmVar4 = iVar2 + *pmVar4;
  resetDiceValuesMap(this);
  iVar2 = addToCount(this);
  if (iVar2 < 6) {
    for (local_38[2] = 0; kVar1 = local_38[2], iVar2 = addToCount(this), (int)kVar1 < 6 - iVar2;
        local_38[2] = local_38[2] + 1) {
      local_2c = randomDiceOption(this);
      pmVar4 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](&this->DiceValues,&local_2c);
      *pmVar4 = *pmVar4 + 1;
    }
    local_38[1] = 3;
    pmVar4 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,local_38 + 1);
    iVar2 = *pmVar4;
    local_38[0] = Heal;
    pmVar4 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->resolvedHand,local_38);
    *pmVar4 = iVar2 + *pmVar4;
    value_2 = Energy;
    pmVar4 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,&value_2);
    iVar2 = *pmVar4;
    i_2 = 0;
    pmVar4 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->resolvedHand,(key_type *)&i_2);
    *pmVar4 = iVar2 + *pmVar4;
    resetDiceValuesMap(this);
  }
  iVar2 = addToCount(this);
  if (iVar2 < 6) {
    for (local_48 = 0; iVar2 = local_48, iVar3 = addToCount(this), iVar2 < 6 - iVar3;
        local_48 = local_48 + 1) {
      local_44 = randomDiceOption(this);
      pmVar4 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](&this->DiceValues,&local_44);
      *pmVar4 = *pmVar4 + 1;
    }
  }
  addDiceValuesToResolvedHand(this);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&local_78,&this->resolvedHand);
  storeResolvedHand(this,&local_78);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~map(&local_78);
  resetResolvedHand(this);
  resetDiceValuesMap(this);
  return;
}

Assistant:

void Dice::rollModerateComputer(){

    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    this->resolvedHand[Heal] += this->DiceValues[Heal];
    this->resolvedHand[Energy] += this->DiceValues[Energy];

    resetDiceValuesMap();

    if(addToCount() <6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }

        this->resolvedHand[Heal] += this->DiceValues[Heal];
        this->resolvedHand[Energy] += this->DiceValues[Energy];
        resetDiceValuesMap();
    }

    if(addToCount() < 6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }
    }

    addDiceValuesToResolvedHand();
    storeResolvedHand(resolvedHand);

    resetResolvedHand();
    resetDiceValuesMap();

}